

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImGuiWindow *window_00;
  ImGuiViewportP *pIVar1;
  bool bVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiWindow **ppIVar4;
  ImDrawData *draw_data;
  ImGuiViewportP *viewport_1;
  int n_3;
  int n_2;
  ImGuiWindow *window;
  int n_1;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiViewportP *viewport;
  int n;
  ImGuiContext *g;
  ImU32 in_stack_00000114;
  ImU32 in_stack_00000118;
  ImU32 in_stack_0000011c;
  ImGuiMouseCursor in_stack_00000120;
  float in_stack_00000124;
  ImDrawList *in_stack_00000128;
  ImVec2 in_stack_00000130;
  ImDrawList *in_stack_ffffffffffffff88;
  ImDrawList *draw_list;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffff90;
  ImGuiWindow *window_01;
  ImGuiWindow *local_68;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb0;
  int local_40;
  int local_3c;
  int local_2c;
  ImGuiWindow *local_28 [2];
  ImGuiViewportP *local_18;
  int local_c;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  CallContextHooks((ImGuiContext *)in_stack_ffffffffffffffb0,
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  for (local_c = 0; local_c != (local_8->Viewports).Size; local_c = local_c + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_c);
    local_18 = *ppIVar3;
    ImDrawDataBuilder::Clear((ImDrawDataBuilder *)in_stack_ffffffffffffff90);
    if (local_18->DrawLists[0] != (ImDrawList *)0x0) {
      GetBackgroundDrawList((ImGuiViewport *)0x137ebc);
      AddDrawListToDrawData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_68 = (ImGuiWindow *)0x0;
  }
  else {
    local_68 = local_8->NavWindowingTarget->RootWindow;
  }
  local_28[0] = local_68;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    window_01 = (ImGuiWindow *)0x0;
  }
  else {
    window_01 = local_8->NavWindowingListWindow;
  }
  local_28[1] = window_01;
  for (local_2c = 0; local_2c != (local_8->Windows).Size; local_2c = local_2c + 1) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_2c);
    window_00 = *ppIVar4;
    bVar2 = IsWindowActiveAndVisible(window_00);
    if ((((bVar2) && ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != local_28[0])) &&
       (window_00 != local_28[1])) {
      AddRootWindowToDrawData(window_01);
    }
  }
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    if ((local_28[local_3c] != (ImGuiWindow *)0x0) &&
       (bVar2 = IsWindowActiveAndVisible(local_28[local_3c]), bVar2)) {
      AddRootWindowToDrawData(window_01);
    }
  }
  (local_8->IO).MetricsRenderIndices = 0;
  (local_8->IO).MetricsRenderVertices = 0;
  for (local_40 = 0; local_40 < (local_8->Viewports).Size; local_40 = local_40 + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_40);
    pIVar1 = *ppIVar3;
    ImDrawDataBuilder::FlattenIntoSingleLayer((ImDrawDataBuilder *)in_stack_ffffffffffffffb0);
    if (((local_8->IO).MouseDrawCursor & 1U) != 0) {
      GetForegroundDrawList((ImGuiViewport *)0x1380bb);
      in_stack_ffffffffffffffb0 = (local_8->IO).MousePos;
      RenderMouseCursor(in_stack_00000128,in_stack_00000130,in_stack_00000124,in_stack_00000120,
                        in_stack_0000011c,in_stack_00000118,in_stack_00000114);
    }
    if (pIVar1->DrawLists[1] != (ImDrawList *)0x0) {
      draw_list = (ImDrawList *)&pIVar1->DrawDataBuilder;
      GetForegroundDrawList((ImGuiViewport *)0x138120);
      AddDrawListToDrawData((ImVector<ImDrawList_*> *)window_01,draw_list);
    }
    SetupViewportDrawData((ImGuiViewportP *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = (ImVector<ImDrawList_*> *)&pIVar1->DrawDataP;
    (local_8->IO).MetricsRenderVertices =
         (pIVar1->DrawDataP).TotalVtxCount + (local_8->IO).MetricsRenderVertices;
    (local_8->IO).MetricsRenderIndices =
         (pIVar1->DrawDataP).TotalIdxCount + (local_8->IO).MetricsRenderIndices;
  }
  CallContextHooks((ImGuiContext *)in_stack_ffffffffffffffb0,
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}